

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O1

void __thiscall Path::Path(Path *this,string *in)

{
  string local_48;
  
  (this->_original)._M_dataplus._M_p = (pointer)&(this->_original).field_2;
  (this->_original)._M_string_length = 0;
  (this->_original).field_2._M_local_buf[0] = '\0';
  (this->_data)._M_dataplus._M_p = (pointer)&(this->_data).field_2;
  (this->_data)._M_string_length = 0;
  (this->_data).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  expand(&local_48,in);
  std::__cxx11::string::operator=((string *)&this->_data,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

Path::Path (const std::string& in)
{
  _original = in;
  _data     = expand (in);
}